

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_graph_demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer ppSVar1;
  ostream *poVar2;
  _List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *e;
  pointer ppSVar3;
  vector<SimpleState_*,_std::allocator<SimpleState_*>_> *__range1;
  int i;
  int iVar4;
  _Function_base *p_Var5;
  CalcHeuristicFunc_t<SimpleState_*,_double> *in_R9;
  int j;
  int iVar6;
  SimpleState **e_1;
  vector<SimpleState_*,_std::allocator<SimpleState_*>_> nodes;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> graph;
  Path<SimpleState_*> path_d;
  Path<SimpleState_*> path_a;
  vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  all_edges;
  _Function_base local_48;
  code *local_30;
  
  nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      graph._0_8_ = operator_new(8);
      *(int *)graph._0_8_ = iVar4;
      *(int *)(graph._0_8_ + 4) = iVar6;
      std::vector<SimpleState*,std::allocator<SimpleState*>>::emplace_back<SimpleState*>
                ((vector<SimpleState*,std::allocator<SimpleState*>> *)&nodes,(SimpleState **)&graph)
      ;
    }
  }
  graph.vertex_map_._M_h._M_buckets = &graph.vertex_map_._M_h._M_single_bucket;
  graph.vertex_map_._M_h._M_bucket_count = 1;
  graph.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  graph.vertex_map_._M_h._M_element_count = 0;
  graph.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  graph.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  graph.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,*nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl
                     .super__Vector_impl_data._M_start,
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[1],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1],
             *nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
              super__Vector_impl_data._M_start,1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[2],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[6],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[2],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[1],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[2],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[3],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[2],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[6],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[3],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[2],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[3],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[6],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[6],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[1],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[6],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[2],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[6],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[3],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[6],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[9],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[6],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[10],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[9],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[6],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[9],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[10],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[9],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[0xd],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[10],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[6],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[10],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[9],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[10],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[0xd],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[0xd],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[9],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&graph,nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[0xd],
             nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
             super__Vector_impl_data._M_start[10],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::GetAllEdges(&all_edges,&graph);
  for (; all_edges.
         super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         all_edges.
         super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      all_edges.
      super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           all_edges.
           super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge::PrintEdge
              ((Edge *)((all_edges.
                         super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_node + 1));
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\nA* search: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  p_Var5 = &local_48;
  local_48._M_functor._8_8_ = 0;
  local_48._M_functor._M_unused._M_object = CalcHeuristic;
  local_30 = std::
             _Function_handler<double_(SimpleState_*,_SimpleState_*),_double_(*)(SimpleState_*,_SimpleState_*)>
             ::_M_invoke;
  local_48._M_manager =
       std::
       _Function_handler<double_(SimpleState_*,_SimpleState_*),_double_(*)(SimpleState_*,_SimpleState_*)>
       ::_M_manager;
  xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
            (&path_a,(AStar *)&graph,(Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0,0xd,
             (int)p_Var5,in_R9);
  std::_Function_base::~_Function_base(&local_48);
  for (; iVar4 = (int)p_Var5,
      path_a.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      path_a.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_finish;
      path_a.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           path_a.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"id: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\nDijkstra search: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  xmotion::Dijkstra::Search<SimpleState*,double,SimpleStateIndexer,int>
            (&path_d,(Dijkstra *)&graph,(Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0,0xd,
             iVar4);
  for (; ppSVar1 = nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,
      ppSVar3 = nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      path_d.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      path_d.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_finish;
      path_d.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           path_d.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"id: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
    operator_delete(*ppSVar3);
  }
  std::_Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>::~_Vector_base
            (&path_d.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>);
  std::_Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>::~_Vector_base
            (&path_a.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>);
  std::
  _Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  ::~_Vector_base(&all_edges.
                   super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                 );
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::~Graph(&graph);
  std::_Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>::~_Vector_base
            (&nodes.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  SimpleStateIndexer indexer;

  std::vector<SimpleState *> nodes;

  // create nodes
  for (int i = 0; i < ROW_SIZE; i++)
    for (int j = 0; j < COL_SIZE; j++) nodes.push_back(new SimpleState(i, j));

  // create a graph
  Graph<SimpleState *, double, SimpleStateIndexer> graph;

  graph.AddEdge(nodes[0], nodes[1], 1.0);
  graph.AddEdge(nodes[1], nodes[0], 1.0);
  graph.AddEdge(nodes[1], nodes[2], 1.0);
  graph.AddEdge(nodes[1], nodes[6], 1.414);
  graph.AddEdge(nodes[2], nodes[1], 1.0);
  graph.AddEdge(nodes[2], nodes[3], 1.0);
  graph.AddEdge(nodes[2], nodes[6], 1.0);
  graph.AddEdge(nodes[3], nodes[2], 1.0);
  graph.AddEdge(nodes[3], nodes[6], 1.414);
  graph.AddEdge(nodes[6], nodes[1], 1.414);
  graph.AddEdge(nodes[6], nodes[2], 1.0);
  graph.AddEdge(nodes[6], nodes[3], 1.414);
  graph.AddEdge(nodes[6], nodes[9], 1.414);
  graph.AddEdge(nodes[6], nodes[10], 1.0);
  graph.AddEdge(nodes[9], nodes[6], 1.414);
  graph.AddEdge(nodes[9], nodes[10], 1.0);
  graph.AddEdge(nodes[9], nodes[13], 1.0);
  graph.AddEdge(nodes[10], nodes[6], 1.0);
  graph.AddEdge(nodes[10], nodes[9], 1.0);
  graph.AddEdge(nodes[10], nodes[13], 1.414);
  graph.AddEdge(nodes[13], nodes[9], 1.0);
  graph.AddEdge(nodes[13], nodes[10], 1.414);

  auto all_edges = graph.GetAllEdges();

  for (auto &e : all_edges) e->PrintEdge();

  // In order to use A* search, you need to specify how to calculate heuristic
  std::cout << "\nA* search: " << std::endl;
  auto path_a = AStar::Search(
      &graph, 0, 13, CalcHeuristicFunc_t<SimpleState *>(CalcHeuristic));
  for (auto &e : path_a) std::cout << "id: " << indexer(e) << std::endl;

  // Dijkstra search
  std::cout << "\nDijkstra search: " << std::endl;
  auto path_d = Dijkstra::Search(&graph, 0, 13);
  for (auto &e : path_d) std::cout << "id: " << indexer(e) << std::endl;

  // need to delete all nodes, the graph only maintains pointers to these nodes
  for (auto &e : nodes) delete e;

  return 0;
}